

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_clip_samples_s16(ma_int16 *pDst,ma_int32 *pSrc,ma_uint64 count)

{
  int local_34;
  ma_int16 local_30;
  int local_2c;
  ma_uint64 iSample;
  ma_uint64 count_local;
  ma_int32 *pSrc_local;
  ma_int16 *pDst_local;
  
  for (iSample = 0; iSample < count; iSample = iSample + 1) {
    local_34 = pSrc[iSample];
    local_2c = local_34;
    if (0x7ffe < local_34) {
      local_2c = 0x7fff;
    }
    if (local_2c < -0x8000) {
      local_30 = -0x8000;
    }
    else {
      if (0x7ffe < local_34) {
        local_34 = 0x7fff;
      }
      local_30 = (ma_int16)local_34;
    }
    pDst[iSample] = local_30;
  }
  return;
}

Assistant:

MA_API void ma_clip_samples_s16(ma_int16* pDst, const ma_int32* pSrc, ma_uint64 count)
{
    ma_uint64 iSample;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    for (iSample = 0; iSample < count; iSample += 1) {
        pDst[iSample] = ma_clip_s16(pSrc[iSample]);
    }
}